

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ostream_logger.cpp
# Opt level: O0

Logger * __thiscall util::logging::Ostream_logger::do_output(Ostream_logger *this,Msg *msg)

{
  bool bVar1;
  M_Level MVar2;
  type pFVar3;
  type pbVar4;
  long lVar5;
  type pbVar6;
  string local_48 [8];
  string fmtmsg;
  undefined1 local_28 [8];
  shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> tout;
  Msg *msg_local;
  Ostream_logger *this_local;
  
  tout.pn.pi_ = (sp_counted_base *)msg;
  MVar2 = Msg::getMsg_lvl(msg);
  if ((MVar2 & (this->super_Logger).verb_lvl) != 0) {
    bVar1 = boost::weak_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::expired
                      (&this->outstream);
    if (!bVar1) {
      boost::weak_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::lock
                ((weak_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_28);
      pFVar3 = boost::shared_ptr<util::logging::Formatter>::operator->
                         (&(this->super_Logger).formatter);
      (*pFVar3->_vptr_Formatter[2])(local_48,pFVar3,tout.pn.pi_);
      pbVar4 = boost::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::operator->
                         ((shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_28
                         );
      lVar5 = std::__cxx11::string::c_str();
      std::__cxx11::string::size();
      std::ostream::write((char *)pbVar4,lVar5);
      pbVar6 = boost::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::operator*
                         ((shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_28
                         );
      std::endl<char,std::char_traits<char>>((ostream *)pbVar6);
      std::__cxx11::string::~string(local_48);
      boost::shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_>::~shared_ptr
                ((shared_ptr<std::basic_ostream<char,_std::char_traits<char>_>_> *)local_28);
    }
  }
  return &this->super_Logger;
}

Assistant:

Logger& Ostream_logger::do_output( const Msg& msg )
		{
			if((msg.getMsg_lvl() & verb_lvl) != 0 and (not outstream.expired()))
			{
				shared_ptr<std::ostream> tout = outstream.lock();

				std::string fmtmsg = formatter->do_formatting(msg);
				tout->write(fmtmsg.c_str(), fmtmsg.size());
				std::endl(*tout);
			}

			return *this;

		}